

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O2

void ssh1_terminal_size(ConnectionLayer *cl,int width,int height)

{
  ConnectionLayerVtable *pCVar1;
  
  *(int *)&cl[-10].vt = width;
  *(int *)((long)&cl[-10].vt + 4) = height;
  pCVar1 = cl[-0xb].vt;
  if (pCVar1 == (ConnectionLayerVtable *)0x0) {
    return;
  }
  *(int *)((long)&pCVar1->add_sharing_x11_display + 4) = width;
  *(int *)&pCVar1->remove_sharing_x11_display = height;
  if ((*(char *)((long)&pCVar1->serverside_x11_open + 7) == '\0') &&
     (*(char *)((long)&pCVar1->add_sharing_x11_display + 2) != '\x01')) {
    return;
  }
  (**(code **)(*(long *)pCVar1->rportfwd_alloc + 0x98))();
  return;
}

Assistant:

static void ssh1_terminal_size(ConnectionLayer *cl, int width, int height)
{
    struct ssh1_connection_state *s =
        container_of(cl, struct ssh1_connection_state, cl);

    s->term_width = width;
    s->term_height = height;
    if (s->mainchan)
        mainchan_terminal_size(s->mainchan, width, height);
}